

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator-=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
          *x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Fad<double> *pFVar5;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *pFVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  value_type vVar16;
  
  pFVar5 = (x->fadexpr_).left_;
  pFVar6 = (x->fadexpr_).right_;
  uVar1 = (pFVar5->dx_).num_elts;
  pFVar7 = (pFVar6->fadexpr_).left_;
  pFVar8 = (pFVar6->fadexpr_).right_;
  uVar2 = (pFVar7->dx_).num_elts;
  uVar3 = (pFVar8->dx_).num_elts;
  uVar13 = uVar3;
  if ((int)uVar3 < (int)uVar2) {
    uVar13 = uVar2;
  }
  if ((int)uVar13 < (int)uVar1) {
    uVar13 = uVar1;
  }
  if (uVar13 != 0) {
    uVar4 = (this->dx_).num_elts;
    uVar15 = (ulong)uVar4;
    if (uVar15 == 0) {
      (this->dx_).num_elts = uVar13;
      uVar15 = 0xffffffffffffffff;
      if (-1 < (int)uVar13) {
        uVar15 = (long)(int)uVar13 << 3;
      }
      pdVar12 = (double *)operator_new__(uVar15);
      (this->dx_).ptr_to_data = pdVar12;
      pFVar5 = (x->fadexpr_).left_;
      if ((((pFVar5->dx_).num_elts == 0) ||
          (pFVar6 = (x->fadexpr_).right_, (((pFVar6->fadexpr_).left_)->dx_).num_elts == 0)) ||
         ((((pFVar6->fadexpr_).right_)->dx_).num_elts == 0)) {
        if (0 < (int)uVar13) {
          uVar15 = 0;
          do {
            vVar16 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
                     ::dx(&x->fadexpr_,(int)uVar15);
            pdVar12[uVar15] = -vVar16;
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
      }
      else if (0 < (int)uVar13) {
        pdVar9 = (pFVar5->dx_).ptr_to_data;
        pFVar6 = (x->fadexpr_).right_;
        pFVar7 = (pFVar6->fadexpr_).left_;
        pFVar8 = (pFVar6->fadexpr_).right_;
        pdVar10 = (pFVar7->dx_).ptr_to_data;
        pdVar11 = (pFVar8->dx_).ptr_to_data;
        uVar15 = 0;
        do {
          pdVar12[uVar15] =
               -((pFVar7->val_ - pFVar8->val_) * pdVar9[uVar15] +
                (pdVar10[uVar15] - pdVar11[uVar15]) * pFVar5->val_);
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
    }
    else {
      pdVar12 = (this->dx_).ptr_to_data;
      if ((uVar2 == 0 || uVar1 == 0) || uVar3 == 0) {
        if (0 < (int)uVar4) {
          uVar14 = 0;
          do {
            vVar16 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
                     ::dx(&x->fadexpr_,(int)uVar14);
            pdVar12[uVar14] = pdVar12[uVar14] - vVar16;
            uVar14 = uVar14 + 1;
          } while (uVar15 != uVar14);
        }
      }
      else if (0 < (int)uVar4) {
        pdVar9 = (pFVar5->dx_).ptr_to_data;
        pdVar10 = (pFVar7->dx_).ptr_to_data;
        pdVar11 = (pFVar8->dx_).ptr_to_data;
        uVar14 = 0;
        do {
          pdVar12[uVar14] =
               pdVar12[uVar14] -
               ((pFVar7->val_ - pFVar8->val_) * pdVar9[uVar14] +
               (pdVar10[uVar14] - pdVar11[uVar14]) * pFVar5->val_);
          uVar14 = uVar14 + 1;
        } while (uVar15 != uVar14);
      }
    }
  }
  pFVar6 = (x->fadexpr_).right_;
  this->val_ = this->val_ -
               (((pFVar6->fadexpr_).left_)->val_ - ((pFVar6->fadexpr_).right_)->val_) *
               ((x->fadexpr_).left_)->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator-= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for(int i=0; i<sz; ++i)
	  dxp[i] -= x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] -= x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for(int i=0; i<xsz; ++i)
	  dxp[i] = -x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = -x.dx(i);
    }
  }

  val_ -= x.val();


  return *this;
}